

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase125::run(TestCase125 *this)

{
  PointerBuilder builder_00;
  PointerReader reader;
  PointerReader reader_00;
  Builder builder_01;
  Builder builder_02;
  Reader reader_01;
  Builder builder_03;
  Reader reader_02;
  Builder reader_03;
  Reader reader_04;
  PointerBuilder builder_04;
  Builder builder_05;
  Builder builder_06;
  Type TVar1;
  long *plVar2;
  ulong uVar4;
  word wVar5;
  ListSchema LVar6;
  Orphanage OVar7;
  Own<capnp::ClientHook,_std::nullptr_t> OVar8;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  initializer_list<unsigned_int> expected;
  initializer_list<unsigned_int> expected_00;
  BuilderFor<capnp::DynamicList> list;
  ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> list_1;
  Builder root;
  Fault f;
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> lorphan;
  Orphan<capnproto_test::capnp::test::TestAllTypes> orphan;
  MallocMessageBuilder builder;
  anon_union_8_2_eba6ea51_for_Type_5 local_400;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_3f8;
  ulong local_3f0;
  OrphanBuilder OStack_3e8;
  anon_union_8_2_eba6ea51_for_Type_5 local_3c8;
  Type TStack_3c0;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  anon_union_8_2_eba6ea51_for_Type_5 in_stack_fffffffffffffc80;
  anon_union_8_2_eba6ea51_for_Type_5 aVar9;
  anon_union_8_2_eba6ea51_for_Type_5 in_stack_fffffffffffffc88;
  WirePointer *in_stack_fffffffffffffc90;
  SegmentBuilder *pSStack_368;
  anon_union_8_2_eba6ea51_for_Type_5 local_358;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffffcc4;
  undefined4 uVar12;
  undefined8 in_stack_fffffffffffffcc8;
  undefined8 in_stack_fffffffffffffcd0;
  anon_union_8_2_eba6ea51_for_Type_5 local_328;
  long *plStack_320;
  undefined4 *local_318;
  ulong uStack_310;
  undefined8 local_308;
  anon_union_8_2_eba6ea51_for_Type_5 local_300;
  long lStack_2f8;
  undefined8 local_2f0;
  ulong uStack_2e8;
  uint local_2dc;
  StructBuilder local_2d8;
  StructBuilder local_2b0;
  StructBuilder local_288;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  Reader local_228;
  Builder local_1f0;
  StructReader local_1c0;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> local_190 [48];
  Type local_160;
  SegmentReader *local_150;
  CapTableReader *pCStack_148;
  byte *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffee0 [16];
  size_type sVar3;
  
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&stack0xfffffffffffffee0,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_400,(MessageBuilder *)&stack0xfffffffffffffee0);
  local_3c8 = local_400;
  aVar9 = in_stack_fffffffffffffc80;
  PointerBuilder::getStruct
            ((StructBuilder *)&stack0xfffffffffffffc80,(PointerBuilder *)&local_3c8,
             (StructSize)0x10000,(word *)0x0);
  local_3c8 = aVar9;
  aVar9 = local_3c8;
  TStack_3c0._0_8_ = in_stack_fffffffffffffc88;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
            (local_190,(EVP_PKEY_CTX *)(schemas::s_a0a8f314b80b63fd + 0x48));
  builder_06.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffec8;
  builder_06.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffec0;
  builder_06.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffed0;
  builder_06.builder.data = (void *)in_stack_fffffffffffffed8;
  builder_06.builder.pointers = (WirePointer *)in_stack_fffffffffffffee0._0_8_;
  builder_06.builder.dataSize = in_stack_fffffffffffffee0._8_4_;
  builder_06.builder.pointerCount = in_stack_fffffffffffffee0._12_2_;
  builder_06.builder._38_2_ = in_stack_fffffffffffffee0._14_2_;
  initDynamicTestMessage(builder_06);
  StructBuilder::asReader((StructBuilder *)&stack0xfffffffffffffc80);
  aStack_3f8 = (anon_union_8_2_eba6ea51_for_Type_5)TStack_3c0._0_8_;
  local_3f0 = (ulong)aStack_3b0;
  local_400 = local_3c8;
  OStack_3e8.tag.content._0_4_ = (undefined4)uStack_3a0;
  if (local_3a8._4_2_ == 0) {
    aStack_3f8.schema = (RawBrandedSchema *)0x0;
    local_3f0 = 0;
    local_400.schema = (RawBrandedSchema *)0x0;
    OStack_3e8.tag.content._0_4_ = 0x7fffffff;
  }
  PointerReader::getStruct(&local_1c0,(PointerReader *)&local_400,(word *)0x0);
  reader_01._reader.capTable = local_1c0.capTable;
  reader_01._reader.segment = local_1c0.segment;
  reader_01._reader.data = local_1c0.data;
  reader_01._reader.pointers = local_1c0.pointers;
  reader_01._reader.dataSize = local_1c0.dataSize;
  reader_01._reader.pointerCount = local_1c0.pointerCount;
  reader_01._reader._38_2_ = local_1c0._38_2_;
  reader_01._reader.nestingLimit = local_1c0.nestingLimit;
  reader_01._reader._44_4_ = local_1c0._44_4_;
  checkTestMessage(reader_01);
  StructBuilder::asReader((StructBuilder *)&stack0xfffffffffffffc80);
  local_3f0 = (ulong)aStack_3b0;
  OStack_3e8.tag.content._0_4_ = (undefined4)uStack_3a0;
  if (local_3a8._4_2_ == 0) {
    TStack_3c0._0_8_ = (RawBrandedSchema *)0x0;
    local_3c8.schema = (RawBrandedSchema *)0x0;
    local_3f0 = 0;
    OStack_3e8.tag.content._0_4_ = 0x7fffffff;
  }
  reader.capTable = (CapTableReader *)TStack_3c0._0_8_;
  reader.segment = (SegmentReader *)local_3c8.schema;
  reader.pointer = (WirePointer *)local_3f0;
  reader._24_8_ = OStack_3e8.tag.content;
  local_400 = local_3c8;
  aStack_3f8 = (anon_union_8_2_eba6ea51_for_Type_5)TStack_3c0._0_8_;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
            (&local_228,reader,(StructSchema)0x6ea968);
  reader_02.reader.segment = local_228.reader.segment;
  reader_02.schema.super_Schema.raw = local_228.schema.super_Schema.raw;
  reader_02.reader.capTable = local_228.reader.capTable;
  reader_02.reader.data = local_228.reader.data;
  reader_02.reader.pointers = local_228.reader.pointers;
  reader_02.reader.dataSize = local_228.reader.dataSize;
  reader_02.reader.pointerCount = local_228.reader.pointerCount;
  reader_02.reader._38_2_ = local_228.reader._38_2_;
  reader_02.reader.nestingLimit = local_228.reader.nestingLimit;
  reader_02.reader._44_4_ = local_228.reader._44_4_;
  checkDynamicTestMessage(reader_02);
  builder_00.capTable = (CapTableBuilder *)in_stack_fffffffffffffc88.schema;
  builder_00.segment = (SegmentBuilder *)aVar9.schema;
  builder_00.pointer = (WirePointer *)pSStack_368;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
            (&local_1f0,builder_00,(StructSchema)0x6ea968);
  builder_03.builder.segment = local_1f0.builder.segment;
  builder_03.schema.super_Schema.raw = local_1f0.schema.super_Schema.raw;
  builder_03.builder.capTable = local_1f0.builder.capTable;
  builder_03.builder.data = local_1f0.builder.data;
  builder_03.builder.pointers = local_1f0.builder.pointers;
  builder_03.builder.dataSize = local_1f0.builder.dataSize;
  builder_03.builder.pointerCount = local_1f0.builder.pointerCount;
  builder_03.builder._38_2_ = local_1f0.builder._38_2_;
  local_3c8 = aVar9;
  checkDynamicTestMessage(builder_03);
  TStack_3c0.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)pSStack_368;
  aVar9 = local_3c8;
  ListSchema::of(UINT32);
  PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::init((EVP_PKEY_CTX *)&local_400);
  local_3c8.scopeId._0_4_ = 3;
  TStack_3c0.baseType = 0x7b;
  TStack_3c0.listDepth = '\0';
  TStack_3c0.isImplicitParam = false;
  TStack_3c0.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  TStack_3c0._6_2_ = 0;
  DynamicList::Builder::set((Builder *)&local_400,0,(Reader *)&local_3c8);
  DynamicValue::Reader::~Reader((Reader *)&local_3c8);
  local_3c8.scopeId._0_4_ = 3;
  TStack_3c0.baseType = 0x1c8;
  TStack_3c0.listDepth = '\0';
  TStack_3c0.isImplicitParam = false;
  TStack_3c0.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  TStack_3c0._6_2_ = 0;
  DynamicList::Builder::set((Builder *)&local_400,1,(Reader *)&local_3c8);
  DynamicValue::Reader::~Reader((Reader *)&local_3c8);
  local_3c8.scopeId._0_4_ = 3;
  TStack_3c0.baseType = 0x315;
  TStack_3c0.listDepth = '\0';
  TStack_3c0.isImplicitParam = false;
  TStack_3c0.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  TStack_3c0._6_2_ = 0;
  DynamicList::Builder::set((Builder *)&local_400,2,(Reader *)&local_3c8);
  DynamicValue::Reader::~Reader((Reader *)&local_3c8);
  local_3c8.scopeId._0_4_ = 3;
  TStack_3c0.baseType = 0xcd15;
  TStack_3c0.listDepth = '[';
  TStack_3c0.isImplicitParam = true;
  TStack_3c0.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  TStack_3c0._6_2_ = 0;
  DynamicList::Builder::set((Builder *)&local_400,3,(Reader *)&local_3c8);
  DynamicValue::Reader::~Reader((Reader *)&local_3c8);
  StructBuilder::asReader((StructBuilder *)&stack0xfffffffffffffc80);
  wVar5.content = OStack_3e8.tag.content;
  local_358 = local_400;
  if (OStack_3e8.segment._4_2_ == 0) {
    OStack_3e8.capTable._0_4_ = 0x7fffffff;
    wVar5.content = 0;
    local_358.schema = (RawBrandedSchema *)0x0;
  }
  PointerReader::getList
            ((ListReader *)&local_3c8,(PointerReader *)&local_358,FOUR_BYTES,(word *)0x0);
  local_400.scopeId._4_4_ = aStack_3b0._0_4_;
  local_400.scopeId._0_4_ = 4;
  aStack_3f8.schema = (RawBrandedSchema *)0x4fd0ae;
  local_3f0 = 5;
  OStack_3e8.tag.content._0_1_ = aStack_3b0._0_4_ == 4;
  if (aStack_3b0._0_4_ != 4) {
    local_328.scopeId._0_4_ = 4;
    local_300.scopeId._0_4_ = aStack_3b0._0_4_;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ((Fault *)&local_358,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x95,FAILED,"(4u) == (list.size())","_kjCondition,4u, list.size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)&local_400,(uint *)&local_328.scopeId,
               (uint *)&local_300.scopeId);
    kj::_::Debug::Fault::fatal((Fault *)&local_358);
  }
  local_400.scopeId._4_4_ = *(undefined4 *)&((SegmentReader *)TStack_3c0.field_4)->arena;
  local_400.scopeId._0_4_ = 0x7b;
  aStack_3f8.schema = (RawBrandedSchema *)0x4fd0ae;
  local_3f0 = 5;
  OStack_3e8.tag.content._0_1_ = local_400.scopeId._4_4_ == 0x7b;
  uVar11 = OStack_3e8.capTable._0_4_;
  if ((!(bool)(undefined1)OStack_3e8.tag.content) && (kj::_::Debug::minSeverity < 3)) {
    local_358.scopeId._0_4_ = 0x7b;
    local_328.scopeId._0_4_ = *(uint *)&((SegmentReader *)TStack_3c0.field_4)->arena;
    kj::_::Debug::
    log<char_const(&)[37],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x96,ERROR,
               "\"failed: expected \" \"(123u) == (list[0])\", _kjCondition, 123u, list[0]",
               (char (*) [37])"failed: expected (123u) == (list[0])",
               (DebugComparison<unsigned_int,_unsigned_int> *)&local_400,(uint *)&local_358.scopeId,
               (uint *)&local_328.scopeId);
    uVar11 = OStack_3e8.capTable._0_4_;
  }
  local_400.scopeId._4_4_ =
       *(int *)((long)&((SegmentReader *)TStack_3c0.field_4)->arena + (aStack_3b0.scopeId >> 0x23));
  local_400.scopeId._0_4_ = 0x1c8;
  aStack_3f8.schema = (RawBrandedSchema *)0x4fd0ae;
  local_3f0 = 5;
  OStack_3e8.tag.content._0_1_ = local_400.scopeId._4_4_ == 0x1c8;
  if ((!(bool)(undefined1)OStack_3e8.tag.content) && (kj::_::Debug::minSeverity < 3)) {
    local_358.scopeId._0_4_ = 0x1c8;
    local_328.scopeId._0_4_ =
         *(undefined4 *)
          ((long)&((SegmentReader *)TStack_3c0.field_4)->arena + (aStack_3b0.scopeId >> 0x23));
    kj::_::Debug::
    log<char_const(&)[37],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x97,ERROR,
               "\"failed: expected \" \"(456u) == (list[1])\", _kjCondition, 456u, list[1]",
               (char (*) [37])"failed: expected (456u) == (list[1])",
               (DebugComparison<unsigned_int,_unsigned_int> *)&local_400,(uint *)&local_358.scopeId,
               (uint *)&local_328.scopeId);
  }
  local_400.scopeId._4_4_ =
       *(int *)((long)&((SegmentReader *)TStack_3c0.field_4)->arena + (aStack_3b0.scopeId >> 0x22));
  local_400.scopeId._0_4_ = 0x315;
  aStack_3f8.schema = (RawBrandedSchema *)0x4fd0ae;
  local_3f0 = 5;
  OStack_3e8.tag.content._0_1_ = local_400.scopeId._4_4_ == 0x315;
  if ((!(bool)(undefined1)OStack_3e8.tag.content) && (kj::_::Debug::minSeverity < 3)) {
    local_358.scopeId._0_4_ = 0x315;
    local_328.scopeId._0_4_ =
         *(undefined4 *)
          ((long)&((SegmentReader *)TStack_3c0.field_4)->arena + (aStack_3b0.scopeId >> 0x22));
    kj::_::Debug::
    log<char_const(&)[37],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x98,ERROR,
               "\"failed: expected \" \"(789u) == (list[2])\", _kjCondition, 789u, list[2]",
               (char (*) [37])"failed: expected (789u) == (list[2])",
               (DebugComparison<unsigned_int,_unsigned_int> *)&local_400,(uint *)&local_358.scopeId,
               (uint *)&local_328.scopeId);
  }
  uVar4 = (aStack_3b0.scopeId >> 0x20) * 3 >> 3;
  local_400.scopeId._4_4_ = *(int *)((long)&((SegmentReader *)TStack_3c0.field_4)->arena + uVar4);
  local_400.scopeId._0_4_ = 0x75bcd15;
  aStack_3f8.schema = (RawBrandedSchema *)0x4fd0ae;
  local_3f0 = 5;
  OStack_3e8.tag.content._0_1_ = local_400.scopeId._4_4_ == 0x75bcd15;
  if ((local_400.scopeId._4_4_ != 0x75bcd15) && (kj::_::Debug::minSeverity < 3)) {
    local_358.scopeId._0_4_ = 0x75bcd15;
    local_328.scopeId._0_4_ =
         *(undefined4 *)((long)&((SegmentReader *)TStack_3c0.field_4)->arena + uVar4);
    kj::_::Debug::
    log<char_const(&)[43],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x99,ERROR,
               "\"failed: expected \" \"(123456789u) == (list[3])\", _kjCondition, 123456789u, list[3]"
               ,(char (*) [43])"failed: expected (123456789u) == (list[3])",
               (DebugComparison<unsigned_int,_unsigned_int> *)&local_400,(uint *)&local_358.scopeId,
               (uint *)&local_328.scopeId);
  }
  StructBuilder::asReader((StructBuilder *)&stack0xfffffffffffffc80);
  aStack_3f8 = (anon_union_8_2_eba6ea51_for_Type_5)TStack_3c0._0_8_;
  local_3f0 = (ulong)aStack_3b0;
  local_400 = local_3c8;
  if (local_3a8._4_2_ == 0) {
    uStack_3a0._0_4_ = 0x7fffffff;
    aStack_3f8 = (anon_union_8_2_eba6ea51_for_Type_5)0;
    local_3f0 = 0;
    local_400.schema = (RawBrandedSchema *)0x0;
  }
  OStack_3e8.tag.content._0_4_ = (undefined4)uStack_3a0;
  LVar6 = ListSchema::of(UINT32);
  sVar3 = LVar6.elementType._0_8_;
  reader_00.capTable = (CapTableReader *)aStack_3f8.schema;
  reader_00.segment = (SegmentReader *)local_400.schema;
  reader_00.pointer = (WirePointer *)local_3f0;
  reader_00._24_8_ = OStack_3e8.tag.content;
  PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic
            ((Reader *)&local_160,reader_00,LVar6);
  local_358.schema = (RawBrandedSchema *)0x1c80000007b;
  uVar10 = 0x75bcd1500000315;
  reader_04.schema.elementType.field_4.schema = local_160.field_4.schema;
  reader_04.schema.elementType.baseType = local_160.baseType;
  reader_04.schema.elementType.listDepth = local_160.listDepth;
  reader_04.schema.elementType.isImplicitParam = local_160.isImplicitParam;
  reader_04.schema.elementType.field_3 = local_160.field_3;
  reader_04.schema.elementType._6_2_ = local_160._6_2_;
  reader_04.reader.segment = local_150;
  reader_04.reader.capTable = pCStack_148;
  reader_04.reader.ptr = in_stack_fffffffffffffec0;
  reader_04.reader.elementCount = (ListElementCount)in_stack_fffffffffffffec8;
  reader_04.reader.step = SUB84(in_stack_fffffffffffffec8,4);
  reader_04.reader.structDataSize = (StructDataBitCount)in_stack_fffffffffffffed0;
  reader_04.reader.structPointerCount = SUB82(in_stack_fffffffffffffed0,4);
  reader_04.reader.elementSize = SUB81(in_stack_fffffffffffffed0,6);
  reader_04.reader._39_1_ = SUB81(in_stack_fffffffffffffed0,7);
  reader_04.reader.nestingLimit = (int)in_stack_fffffffffffffed8;
  reader_04.reader._44_4_ = SUB84(in_stack_fffffffffffffed8,4);
  expected._M_len = sVar3;
  expected._M_array = (iterator)&local_358;
  _::(anonymous_namespace)::checkList<unsigned_int,capnp::DynamicList::Reader>(reader_04,expected);
  local_3c8 = aVar9;
  aVar9 = local_3c8;
  TStack_3c0._0_8_ = in_stack_fffffffffffffc88;
  LVar6 = ListSchema::of(UINT32);
  sVar3 = LVar6.elementType._0_8_;
  builder_04.capTable = (CapTableBuilder *)in_stack_fffffffffffffc88.schema;
  builder_04.segment = (SegmentBuilder *)aVar9.schema;
  builder_04.pointer = in_stack_fffffffffffffc90;
  LVar6.elementType.field_4.schema = (RawBrandedSchema *)TStack_3c0._0_8_;
  LVar6.elementType._0_8_ = local_3c8.schema;
  PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic(builder_04,LVar6);
  local_400.schema = (RawBrandedSchema *)0x1c80000007b;
  aStack_3f8.schema = (RawBrandedSchema *)0x75bcd1500000315;
  reader_03.schema.elementType.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)uStack_258;
  reader_03.schema.elementType.baseType = (undefined2)local_260;
  reader_03.schema.elementType.listDepth = local_260._2_1_;
  reader_03.schema.elementType.isImplicitParam = (bool)local_260._3_1_;
  reader_03.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_260._4_2_;
  reader_03.schema.elementType._6_2_ = local_260._6_2_;
  reader_03.builder.segment = (SegmentBuilder *)local_250;
  reader_03.builder.capTable = (CapTableBuilder *)uStack_248;
  reader_03.builder.ptr = (byte *)local_240;
  reader_03.builder.elementCount = (undefined4)uStack_238;
  reader_03.builder.step = uStack_238._4_4_;
  reader_03.builder.structDataSize = (undefined4)local_230;
  reader_03.builder.structPointerCount = local_230._4_2_;
  reader_03.builder.elementSize = local_230._6_1_;
  reader_03.builder._39_1_ = local_230._7_1_;
  expected_00._M_len = sVar3;
  expected_00._M_array = (iterator)&local_400;
  _::(anonymous_namespace)::checkList<unsigned_int,capnp::DynamicList::Builder>
            (reader_03,expected_00);
  local_400.schema = (RawBrandedSchema *)&PTR_s_e3da5a2ccd28c0d8_006eaa78;
  local_3c8.scopeId._0_4_ = 6;
  TStack_3c0.field_4.scopeId = 4;
  TStack_3c0._0_8_ = "foo";
  name.content.size_ = 0x10;
  name.content.ptr = "anyPointerField";
  DynamicStruct::Builder::set((Builder *)&local_400,name,(Reader *)&local_3c8);
  DynamicValue::Reader::~Reader((Reader *)&local_3c8);
  local_328 = (anon_union_8_2_eba6ea51_for_Type_5)0x4fd648;
  PointerBuilder::getBlob<capnp::Text>
            ((Builder *)&local_358,(PointerBuilder *)&local_400,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&local_3c8,
             (DebugExpression<char_const(&)[4]> *)&local_328,(Builder *)&local_358);
  if (((char)local_398 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    PointerBuilder::getBlob<capnp::Text>
              ((Builder *)&local_358,(PointerBuilder *)&local_400,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[70],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0xa4,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (root.getAnyPointerField().getAs<Text>())\", _kjCondition, \"foo\", root.getAnyPointerField().getAs<Text>()"
               ,(char (*) [70])
                "failed: expected (\"foo\") == (root.getAnyPointerField().getAs<Text>())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&local_3c8,
               (char (*) [4])"foo",(Builder *)&local_358);
  }
  OVar7 = MessageBuilder::getOrphanage((MessageBuilder *)&stack0xfffffffffffffee0);
  OrphanBuilder::initStruct
            ((OrphanBuilder *)&local_3c8,OVar7.arena,OVar7.capTable,(StructSize)0x140006);
  TVar1 = TStack_3c0;
  local_2f0 = TStack_3c0.field_4;
  uStack_2e8 = (ulong)aStack_3b0;
  local_300.schema = local_3c8.schema;
  lStack_2f8._0_2_ = TStack_3c0.baseType;
  lStack_2f8._2_1_ = TStack_3c0.listDepth;
  lStack_2f8._3_1_ = TStack_3c0.isImplicitParam;
  lStack_2f8._4_2_ = TStack_3c0.field_3;
  lStack_2f8._6_2_ = TStack_3c0._6_2_;
  TStack_3c0 = TVar1;
  OrphanBuilder::asStruct(&local_288,(OrphanBuilder *)&local_300,(StructSize)0x140006);
  builder_05._builder.capTable = (CapTableBuilder *)wVar5.content;
  builder_05._builder.segment = (SegmentBuilder *)uVar10;
  builder_05._builder.data._0_4_ = uVar11;
  builder_05._builder.data._4_4_ = in_stack_fffffffffffffcc4;
  builder_05._builder.pointers = (WirePointer *)in_stack_fffffffffffffcc8;
  builder_05._builder.dataSize = (int)in_stack_fffffffffffffcd0;
  builder_05._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffcd0 >> 0x20);
  builder_05._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffcd0 >> 0x30);
  initTestMessage(builder_05);
  OStack_3e8.segment = pSStack_368;
  local_400.schema = (RawBrandedSchema *)&PTR_s_e3da5a2ccd28c0d8_006eaa78;
  aStack_3b0 = (anon_union_8_2_eba6ea51_for_Type_5)uVar10;
  local_3a8 = wVar5.content;
  OrphanBuilder::asStructReader
            ((StructReader *)&local_358,(OrphanBuilder *)&local_300,(StructSize)0x140006);
  uStack_3a0 = CONCAT44(in_stack_fffffffffffffcc4,uVar11);
  local_3c8.scopeId._0_4_ = 10;
  TStack_3c0._0_8_ = schemas::s_a0a8f314b80b63fd + 0x48;
  TStack_3c0.field_4 = local_358;
  name_00.content.size_ = 0x10;
  name_00.content.ptr = "anyPointerField";
  DynamicStruct::Builder::set((Builder *)&local_400,name_00,(Reader *)&local_3c8);
  DynamicValue::Reader::~Reader((Reader *)&local_3c8);
  local_3c8 = aVar9;
  aVar9 = local_3c8;
  PointerBuilder::getStruct
            (&local_2b0,(PointerBuilder *)&local_3c8,(StructSize)0x140006,(word *)0x0);
  builder_01._builder.capTable = local_2b0.capTable;
  builder_01._builder.segment = local_2b0.segment;
  builder_01._builder.data = local_2b0.data;
  builder_01._builder.pointers = local_2b0.pointers;
  builder_01._builder.dataSize = local_2b0.dataSize;
  builder_01._builder.pointerCount = local_2b0.pointerCount;
  builder_01._builder._38_2_ = local_2b0._38_2_;
  checkTestMessage(builder_01);
  uVar11 = SUB84(in_stack_fffffffffffffc90,0);
  uVar12 = (undefined4)((ulong)in_stack_fffffffffffffc90 >> 0x20);
  local_358.schema = (RawBrandedSchema *)&PTR_s_e3da5a2ccd28c0d8_006eaa78;
  OrphanBuilder::asStruct
            ((StructBuilder *)&local_328,(OrphanBuilder *)&local_300,(StructSize)0x140006);
  local_398 = local_308;
  local_3a8 = (uint64_t)local_318;
  uStack_3a0 = uStack_310;
  aStack_3b0 = (anon_union_8_2_eba6ea51_for_Type_5)plStack_320;
  local_3c8.scopeId._0_4_ = 10;
  TStack_3c0._0_8_ = schemas::s_a0a8f314b80b63fd + 0x48;
  TStack_3c0.field_4 = local_328;
  Orphan<capnp::DynamicValue>::Orphan
            ((Orphan<capnp::DynamicValue> *)&local_400,(Builder *)&local_3c8,
             (OrphanBuilder *)&local_300);
  DynamicValue::Builder::~Builder((Builder *)&local_3c8);
  name_01.content.size_ = 0x10;
  name_01.content.ptr = "anyPointerField";
  DynamicStruct::Builder::adopt
            ((Builder *)&local_358,name_01,(Orphan<capnp::DynamicValue> *)&local_400);
  if (OStack_3e8.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&OStack_3e8);
  }
  local_3c8 = aVar9;
  TStack_3c0.field_4.schema = (RawBrandedSchema *)pSStack_368;
  TStack_3c0._0_8_ = in_stack_fffffffffffffc88.schema;
  aVar9 = local_3c8;
  PointerBuilder::getStruct
            (&local_2d8,(PointerBuilder *)&local_3c8,(StructSize)0x140006,(word *)0x0);
  builder_02._builder.capTable = local_2d8.capTable;
  builder_02._builder.segment = local_2d8.segment;
  builder_02._builder.data = local_2d8.data;
  builder_02._builder.pointers = local_2d8.pointers;
  builder_02._builder.dataSize = local_2d8.dataSize;
  builder_02._builder.pointerCount = local_2d8.pointerCount;
  builder_02._builder._38_2_ = local_2d8._38_2_;
  checkTestMessage(builder_02);
  if (lStack_2f8 != 0) {
    OrphanBuilder::euthanize((OrphanBuilder *)&local_300);
  }
  OVar7 = MessageBuilder::getOrphanage((MessageBuilder *)&stack0xfffffffffffffee0);
  OrphanBuilder::initList((OrphanBuilder *)&local_3c8,OVar7.arena,OVar7.capTable,3,FOUR_BYTES);
  local_318 = (undefined4 *)TStack_3c0.field_4;
  uStack_310 = (ulong)aStack_3b0;
  local_328.schema = local_3c8.schema;
  plStack_320 = (long *)TStack_3c0._0_8_;
  OrphanBuilder::asList((ListBuilder *)&local_3c8,(OrphanBuilder *)&local_328,FOUR_BYTES);
  *(undefined4 *)TStack_3c0.field_4 = 0xc;
  OrphanBuilder::asList((ListBuilder *)&local_3c8,(OrphanBuilder *)&local_328,FOUR_BYTES);
  *(undefined4 *)((long)TStack_3c0.field_4 + ((ulong)aStack_3b0 >> 0x23)) = 0x22;
  OStack_3e8.tag.content = (uint64_t)in_stack_fffffffffffffc90;
  OrphanBuilder::asList((ListBuilder *)&local_3c8,(OrphanBuilder *)&local_328,FOUR_BYTES);
  *(undefined4 *)((long)TStack_3c0.field_4 + ((ulong)aStack_3b0 >> 0x22)) = 0x38;
  local_400.schema = (RawBrandedSchema *)&PTR_s_e3da5a2ccd28c0d8_006eaa78;
  OrphanBuilder::asListReader((ListReader *)&local_358,(OrphanBuilder *)&local_328,FOUR_BYTES);
  TStack_3c0 = (Type)ListSchema::of(UINT32);
  local_398 = CONCAT44(uVar12,uVar11);
  aStack_3b0.schema = local_358.schema;
  local_3c8.scopeId._0_4_ = 8;
  name_02.content.size_ = 0x10;
  name_02.content.ptr = "anyPointerField";
  DynamicStruct::Builder::set((Builder *)&local_400,name_02,(Reader *)&local_3c8);
  DynamicValue::Reader::~Reader((Reader *)&local_3c8);
  PointerBuilder::getList
            ((ListBuilder *)&local_3c8,(PointerBuilder *)&local_400,FOUR_BYTES,(word *)0x0);
  local_400.scopeId._4_4_ = aStack_3b0._0_4_;
  local_400.scopeId._0_4_ = 3;
  aStack_3f8.schema = (RawBrandedSchema *)0x4fd0ae;
  local_3f0 = 5;
  OStack_3e8.tag.content._0_1_ = aStack_3b0._0_4_ == 3;
  if (aStack_3b0._0_4_ != 3) {
    local_300.scopeId._0_4_ = 3;
    local_2dc = aStack_3b0._0_4_;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ((Fault *)&local_358,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0xb7,FAILED,"(3) == (l.size())","_kjCondition,3, l.size()",
               (DebugComparison<int,_unsigned_int> *)&local_400,(int *)&local_300.scopeId,&local_2dc
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_358);
  }
  local_400.scopeId._4_4_ = *(int *)&(TStack_3c0.field_4.schema)->generic;
  local_400.scopeId._0_4_ = 0xc;
  aStack_3f8.schema = (RawBrandedSchema *)0x4fd0ae;
  local_3f0 = 5;
  OStack_3e8.tag.content._0_1_ = *(int *)&(TStack_3c0.field_4.schema)->generic == 0xc;
  if ((!(bool)(undefined1)OStack_3e8.tag.content) && (kj::_::Debug::minSeverity < 3)) {
    local_358.scopeId._0_4_ = 0xc;
    local_300.scopeId._0_4_ = *(undefined4 *)&(TStack_3c0.field_4.schema)->generic;
    kj::_::Debug::log<char_const(&)[32],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0xb8,ERROR,"\"failed: expected \" \"(12) == (l[0])\", _kjCondition, 12, l[0]",
               (char (*) [32])"failed: expected (12) == (l[0])",
               (DebugComparison<int,_unsigned_int> *)&local_400,(int *)&local_358.scopeId,
               (uint *)&local_300.scopeId);
  }
  local_400.scopeId._4_4_ =
       *(int *)((long)&(TStack_3c0.field_4.schema)->generic + (aStack_3b0.scopeId >> 0x23));
  local_400.scopeId._0_4_ = 0x22;
  aStack_3f8.schema = (RawBrandedSchema *)0x4fd0ae;
  local_3f0 = 5;
  OStack_3e8.tag.content._0_1_ = local_400.scopeId._4_4_ == 0x22;
  if ((!(bool)(undefined1)OStack_3e8.tag.content) && (kj::_::Debug::minSeverity < 3)) {
    local_358.scopeId._0_4_ = 0x22;
    local_300.scopeId._0_4_ =
         *(undefined4 *)((long)&(TStack_3c0.field_4.schema)->generic + (aStack_3b0.scopeId >> 0x23))
    ;
    kj::_::Debug::log<char_const(&)[32],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0xb9,ERROR,"\"failed: expected \" \"(34) == (l[1])\", _kjCondition, 34, l[1]",
               (char (*) [32])"failed: expected (34) == (l[1])",
               (DebugComparison<int,_unsigned_int> *)&local_400,(int *)&local_358.scopeId,
               (uint *)&local_300.scopeId);
  }
  local_400.scopeId._4_4_ =
       *(int *)((long)&(TStack_3c0.field_4.schema)->generic + (aStack_3b0.scopeId >> 0x22));
  local_400.scopeId._0_4_ = 0x38;
  aStack_3f8.schema = (RawBrandedSchema *)0x4fd0ae;
  local_3f0 = 5;
  OStack_3e8.tag.content._0_1_ = local_400.scopeId._4_4_ == 0x38;
  if ((local_400.scopeId._4_4_ != 0x38) && (kj::_::Debug::minSeverity < 3)) {
    local_358.scopeId._0_4_ = 0x38;
    local_300.scopeId._0_4_ =
         *(undefined4 *)((long)&(TStack_3c0.field_4.schema)->generic + (aStack_3b0.scopeId >> 0x22))
    ;
    kj::_::Debug::log<char_const(&)[32],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0xba,ERROR,"\"failed: expected \" \"(56) == (l[2])\", _kjCondition, 56, l[2]",
               (char (*) [32])"failed: expected (56) == (l[2])",
               (DebugComparison<int,_unsigned_int> *)&local_400,(int *)&local_358.scopeId,
               (uint *)&local_300.scopeId);
  }
  if (plStack_320 != (long *)0x0) {
    OrphanBuilder::euthanize((OrphanBuilder *)&local_328);
  }
  aStack_3f8 = aVar9;
  local_400.schema = (RawBrandedSchema *)&PTR_s_e3da5a2ccd28c0d8_006eaa78;
  Capability::Client::Client((Client *)&local_328,(void *)0x0);
  (**(code **)(*plStack_320 + 0x20))(&local_358);
  local_3c8.scopeId._0_4_ = 0xb;
  TStack_3c0._0_8_ = local_358;
  aStack_3b0 = (anon_union_8_2_eba6ea51_for_Type_5)(NULL_INTERFACE_SCHEMA + 0x48);
  name_03.content.size_ = 0x10;
  name_03.content.ptr = "anyPointerField";
  DynamicStruct::Builder::set((Builder *)&local_400,name_03,(Reader *)&local_3c8);
  DynamicValue::Reader::~Reader((Reader *)&local_3c8);
  plVar2 = plStack_320;
  if (plStack_320 != (long *)0x0) {
    plStack_320 = (long *)0x0;
    (*(code *)(local_328.schema)->generic->id)
              (local_328.schema,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  OVar8 = PointerBuilder::getCapability((PointerBuilder *)&local_400);
  if (aStack_3f8.schema != (RawBrandedSchema *)0x0) {
    (*(code *)(local_400.schema)->generic->id)
              (local_400.schema,
               (long)&(aStack_3f8.schema)->generic +
               (long)(aStack_3f8.schema)->generic[-1].defaultBrand.lazyInitializer,OVar8.ptr);
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&stack0xfffffffffffffee0);
  return;
}

Assistant:

TEST(DynamicApi, AnyPointers) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<test::TestAnyPointer>();

  initDynamicTestMessage(
      root.getAnyPointerField().initAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkTestMessage(root.asReader().getAnyPointerField().getAs<TestAllTypes>());

  checkDynamicTestMessage(
      root.asReader().getAnyPointerField().getAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkDynamicTestMessage(
      root.getAnyPointerField().getAs<DynamicStruct>(Schema::from<TestAllTypes>()));

  {
    {
      auto list = root.getAnyPointerField().initAs<DynamicList>(Schema::from<List<uint32_t>>(), 4);
      list.set(0, 123);
      list.set(1, 456);
      list.set(2, 789);
      list.set(3, 123456789);
    }

    {
      auto list = root.asReader().getAnyPointerField().getAs<List<uint32_t>>();
      ASSERT_EQ(4u, list.size());
      EXPECT_EQ(123u, list[0]);
      EXPECT_EQ(456u, list[1]);
      EXPECT_EQ(789u, list[2]);
      EXPECT_EQ(123456789u, list[3]);
    }

    checkList<uint32_t>(root.asReader().getAnyPointerField().getAs<DynamicList>(
        Schema::from<List<uint32_t>>()), {123u, 456u, 789u, 123456789u});
    checkList<uint32_t>(root.getAnyPointerField().getAs<DynamicList>(
        Schema::from<List<uint32_t>>()), {123u, 456u, 789u, 123456789u});
  }

  // Setting an AnyPointer to various types should work.
  toDynamic(root).set("anyPointerField", capnp::Text::Reader("foo"));
  EXPECT_EQ("foo", root.getAnyPointerField().getAs<Text>());

  {
    auto orphan = builder.getOrphanage().newOrphan<TestAllTypes>();
    initTestMessage(orphan.get());
    toDynamic(root).set("anyPointerField", orphan.getReader());
    checkTestMessage(root.getAnyPointerField().getAs<TestAllTypes>());

    toDynamic(root).adopt("anyPointerField", kj::mv(orphan));
    checkTestMessage(root.getAnyPointerField().getAs<TestAllTypes>());
  }

  {
    auto lorphan = builder.getOrphanage().newOrphan<List<uint32_t>>(3);
    lorphan.get().set(0, 12);
    lorphan.get().set(1, 34);
    lorphan.get().set(2, 56);
    toDynamic(root).set("anyPointerField", lorphan.getReader());
    auto l = root.getAnyPointerField().getAs<List<uint32_t>>();
    ASSERT_EQ(3, l.size());
    EXPECT_EQ(12, l[0]);
    EXPECT_EQ(34, l[1]);
    EXPECT_EQ(56, l[2]);
  }

  // Just compile this one.
  toDynamic(root).set("anyPointerField", Capability::Client(nullptr));
  root.getAnyPointerField().getAs<Capability>();
}